

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O2

int splittingStep_TakeStep(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  SplittingStepCoefficients pSVar1;
  ARKodeSplittingStepMem step_mem_00;
  int iVar2;
  int i;
  long lVar3;
  ARKodeSplittingStepMem step_mem;
  
  step_mem = (ARKodeSplittingStepMem)0x0;
  iVar2 = splittingStep_AccessStepMem(ark_mem,"splittingStep_TakeStep",&step_mem);
  step_mem_00 = step_mem;
  if (iVar2 == 0) {
    *nflagPtr = 0;
    *dsmPtr = 0.0;
    pSVar1 = step_mem->coefficients;
    N_VScale(0x3ff0000000000000,ark_mem->yn,ark_mem->ycur);
    iVar2 = splittingStep_SequentialMethod(ark_mem,step_mem_00,0,ark_mem->ycur);
    if (iVar2 == 0) {
      if ((*pSVar1->alpha != 1.0) || (NAN(*pSVar1->alpha))) {
        N_VScale(ark_mem->ycur,ark_mem->ycur);
      }
      for (lVar3 = 1; lVar3 < pSVar1->sequential_methods; lVar3 = lVar3 + 1) {
        N_VScale(0x3ff0000000000000,ark_mem->yn,ark_mem->tempv1);
        iVar2 = splittingStep_SequentialMethod(ark_mem,step_mem_00,(int)lVar3,ark_mem->tempv1);
        if (iVar2 != 0) {
          return iVar2;
        }
        N_VLinearSum(0x3ff0000000000000,pSVar1->alpha[lVar3],ark_mem->ycur,ark_mem->tempv1,
                     ark_mem->ycur);
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int splittingStep_TakeStep(ARKodeMem ark_mem, sunrealtype* dsmPtr,
                                  int* nflagPtr)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  *nflagPtr = ARK_SUCCESS; /* No algebraic solver */
  *dsmPtr   = ZERO;        /* No error estimate */

  SplittingStepCoefficients coefficients = step_mem->coefficients;

  SUNLogInfo(ARK_LOGGER, "begin-sequential-method", "sequential method = 0");

  N_VScale(ONE, ark_mem->yn, ark_mem->ycur);
  retval = splittingStep_SequentialMethod(ark_mem, step_mem, 0, ark_mem->ycur);
  SUNLogExtraDebugVec(ARK_LOGGER, "sequential state", ark_mem->ycur,
                      "y_seq(:) =");
  if (retval != ARK_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-sequential-method",
               "status = failed sequential method, retval = %i", retval);
    return retval;
  }

  if (coefficients->alpha[0] != ONE)
  {
    N_VScale(coefficients->alpha[0], ark_mem->ycur, ark_mem->ycur);
  }
  SUNLogExtraDebugVec(ARK_LOGGER, "current state", ark_mem->ycur, "y_cur(:) =");
  SUNLogInfo(ARK_LOGGER, "end-sequential-method", "status = success");

  for (int i = 1; i < coefficients->sequential_methods; i++)
  {
    SUNLogInfo(ARK_LOGGER, "begin-sequential-method", "sequential method = %i",
               i);

    N_VScale(ONE, ark_mem->yn, ark_mem->tempv1);
    retval = splittingStep_SequentialMethod(ark_mem, step_mem, i,
                                            ark_mem->tempv1);
    SUNLogExtraDebugVec(ARK_LOGGER, "sequential state", ark_mem->tempv1,
                        "y_seq(:) =");
    if (retval != ARK_SUCCESS)
    {
      SUNLogInfo(ARK_LOGGER, "end-sequential-method",
                 "status = failed sequential method, retval = %i", retval);
      return retval;
    }
    N_VLinearSum(ONE, ark_mem->ycur, coefficients->alpha[i], ark_mem->tempv1,
                 ark_mem->ycur);

    SUNLogExtraDebugVec(ARK_LOGGER, "current state", ark_mem->ycur, "y_cur(:) =");
    SUNLogInfo(ARK_LOGGER, "end-sequential-method", "status = success");
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "current state", ark_mem->ycur, "y_cur(:) =");

  return ARK_SUCCESS;
}